

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LRUSet-inl.hh
# Opt level: O3

bool __thiscall
phosg::LRUSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
change_size(LRUSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *k,
           size_t new_size)

{
  bool bVar1;
  iterator iVar2;
  undefined1 auVar3 [12];
  
  iVar2 = ::std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phosg::LRUSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Item>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phosg::LRUSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Item>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->items)._M_h,k);
  if (iVar2.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phosg::LRUSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Item>,_true>
      ._M_cur == (__node_type *)0x0) {
    auVar3 = ::std::__throw_out_of_range("_Map_base::at");
    if (auVar3._8_4_ != 1) {
      _Unwind_Resume(auVar3._0_8_);
    }
    __cxa_begin_catch();
    __cxa_end_catch();
    bVar1 = false;
  }
  else {
    this->total_size =
         this->total_size +
         (new_size -
         *(long *)((long)iVar2.
                         super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phosg::LRUSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Item>,_true>
                         ._M_cur + 0x40));
    *(size_t *)
     ((long)iVar2.
            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phosg::LRUSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Item>,_true>
            ._M_cur + 0x40) = new_size;
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

bool LRUSet<K>::change_size(const K& k, size_t new_size) {
  try {
    Item& i = this->items.at(k);
    this->total_size += new_size - i.size;
    i.size = new_size;
    return true;
  } catch (const std::out_of_range& e) {
    return false;
  }
}